

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O0

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,4ul>,int,int>
               (SmallVector<(anonymous_namespace)::Constructable,_4UL> *v,int *args,int *args_1)

{
  StringRef capturedExpression;
  StringRef macroName;
  bool bVar1;
  ExprLhs<bool> EVar2;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  AssertionHandler catchAssertionHandler;
  array<int,_2UL> a;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  SourceLineInfo *this;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  Flags in_stack_ffffffffffffff60;
  SourceLineInfo local_88;
  StringRef local_78;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_8;
  
  local_20 = *in_RSI;
  local_1c = *in_RDX;
  local_8 = in_RDI;
  local_78 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  this = &local_88;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
             ,0x6b);
  operator____catch_sr
            ((char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  uVar3 = 2;
  macroName.m_size = in_stack_ffffffffffffff50;
  macroName.m_start = in_stack_ffffffffffffff48;
  capturedExpression.m_size._0_4_ = in_stack_ffffffffffffff40;
  capturedExpression.m_start = (char *)this;
  capturedExpression.m_size._4_4_ = in_stack_ffffffffffffff44;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             macroName,(SourceLineInfo *)CONCAT44(in_stack_ffffffffffffff2c,2),capturedExpression,
             in_stack_ffffffffffffff60);
  bVar1 = std::ranges::__equal_fn::
          operator()<slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>_&,_std::array<int,_2UL>_&,_std::ranges::equal_to,_int_((anonymous_namespace)::Constructable::*)()_const,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,local_8,&local_20,
                     anon_unknown.dwarf_70180c::Constructable::getValue,0);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff40);
  EVar2 = Catch::operator<=<bool,_0>((Decomposer *)CONCAT44(in_stack_ffffffffffffff2c,uVar3),false);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)CONCAT44(in_stack_ffffffffffffff44,uVar4),(ExprLhs<bool> *)this);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(EVar2.m_lhs,in_stack_ffffffffffffff30));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(EVar2.m_lhs,in_stack_ffffffffffffff30));
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}